

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wabtapi.cc
# Opt level: O2

void write_invalid_module(Context *ctx,Var obj,ScriptModule *module,string *text)

{
  ScriptModuleType SVar1;
  CreateBufferFn p_Var2;
  uchar *puVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  TextScriptModule *pTVar6;
  DataScriptModule<(wabt::ScriptModuleType)1> *pDVar7;
  Var value;
  
  iVar4 = (*module->_vptr_ScriptModule[2])(module);
  write_location(ctx,obj,(Location *)CONCAT44(extraout_var,iVar4));
  write_string(ctx,obj,10,text);
  SVar1 = module->type_;
  if (SVar1 == Quoted) {
    pDVar7 = (DataScriptModule<(wabt::ScriptModuleType)1> *)
             wabt::cast<wabt::DataScriptModule<(wabt::ScriptModuleType)2>,wabt::ScriptModule>
                       (module);
  }
  else {
    if (SVar1 != Binary) {
      if (SVar1 == Text) {
        pTVar6 = wabt::cast<wabt::TextScriptModule,wabt::ScriptModule>(module);
        write_module(ctx,obj,&pTVar6->module,false);
        return;
      }
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/chakra/wabtapi.cc"
                    ,0x14e,
                    "void write_invalid_module(Context *, Js::Var, const ScriptModule *, const std::string &)"
                   );
    }
    pDVar7 = wabt::cast<wabt::DataScriptModule<(wabt::ScriptModuleType)1>,wabt::ScriptModule>
                       (module);
  }
  p_Var2 = ctx->chakra->createBuffer;
  puVar3 = (pDVar7->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = TruncSizeT((long)(pDVar7->data).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish - (long)puVar3);
  value = (*p_Var2)(puVar3,uVar5,ctx->chakra->user_data);
  set_property(ctx,obj,3,value,"Unable to set invalid module");
  return;
}

Assistant:

static void write_invalid_module(Context* ctx, Js::Var obj, const ScriptModule* module, const std::string& text)
{
    write_location(ctx, obj, &module->location());
    write_string(ctx, obj, PropertyIds::text, text);
    const std::vector<uint8_t>* data = nullptr;
    switch (module->type())
    {
    case ScriptModuleType::Text:
        write_module(ctx, obj, &cast<TextScriptModule>(module)->module, false);
        break;
    case ScriptModuleType::Binary:
        data = &cast<BinaryScriptModule>(module)->data;
        goto create_binary_module;
    case ScriptModuleType::Quoted:
        data = &cast<QuotedScriptModule>(module)->data;
    create_binary_module:
        {
            Js::Var buffer = ctx->chakra->createBuffer(data->data(), TruncSizeT(data->size()), ctx->chakra->user_data);
            set_property(ctx, obj, PropertyIds::buffer, buffer, "Unable to set invalid module");
            break;
        }
    default:
        assert(false);
        break;
    }
}